

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_divs_16_ix(void)

{
  long lVar1;
  uint uVar2;
  uint addr_in;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar2 = m68ki_cpu.ir;
  addr_in = m68ki_get_ea_ix(m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8]);
  my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
  if (m68ki_cpu.pmmu_enabled != 0) {
    addr_in = pmmu_translate_addr(addr_in);
  }
  uVar3 = m68k_read_memory_16(addr_in & m68ki_cpu.address_mask);
  if ((uVar3 & 0xffff) == 0) {
    m68ki_exception_trap(5);
    return;
  }
  uVar5 = uVar2 >> 9 & 7;
  lVar1 = (long)(int)m68ki_cpu.dar[uVar5] / (long)(int)(short)uVar3;
  uVar4 = (uint)lVar1;
  if ((int)(short)lVar1 == uVar4) {
    m68ki_cpu.n_flag = (int)uVar4 >> 8;
    m68ki_cpu.v_flag = 0;
    m68ki_cpu.c_flag = 0;
    m68ki_cpu.not_z_flag = uVar4;
    m68ki_cpu.dar[uVar5] = (int)m68ki_cpu.dar[uVar5] % (int)(short)uVar3 << 0x10 | uVar4 & 0xffff;
  }
  else {
    m68ki_cpu.v_flag = 0x80;
  }
  return;
}

Assistant:

static void m68k_op_divs_16_ix(void)
{
	uint* r_dst = &DX;
	sint src = MAKE_INT_16(OPER_AY_IX_16());
	sint quotient;
	sint remainder;

	if(src != 0)
	{
		if((uint32)*r_dst == 0x80000000 && src == -1)
		{
			FLAG_Z = 0;
			FLAG_N = NFLAG_CLEAR;
			FLAG_V = VFLAG_CLEAR;
			FLAG_C = CFLAG_CLEAR;
			*r_dst = 0;
			return;
		}

		quotient = MAKE_INT_32(*r_dst) / src;
		remainder = MAKE_INT_32(*r_dst) % src;

		if(quotient == MAKE_INT_16(quotient))
		{
			FLAG_Z = quotient;
			FLAG_N = NFLAG_16(quotient);
			FLAG_V = VFLAG_CLEAR;
			FLAG_C = CFLAG_CLEAR;
			*r_dst = MASK_OUT_ABOVE_32(MASK_OUT_ABOVE_16(quotient) | (remainder << 16));
			return;
		}
		FLAG_V = VFLAG_SET;
		return;
	}
	m68ki_exception_trap(EXCEPTION_ZERO_DIVIDE);
}